

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

bool convertToIpv4(quint32 *a,Q_IPV6ADDR *a6,ConversionMode mode)

{
  bool bVar1;
  uint uVar2;
  Int IVar3;
  uint uVar4;
  long *in_RSI;
  uint *in_RDI;
  long in_FS_OFFSET;
  quint32 low;
  quint32 mid;
  uchar *ptr;
  size_t size;
  unsigned_long_long dest;
  ConversionModeFlag in_stack_ffffffffffffff9c;
  undefined2 uVar6;
  ConversionModeFlag CVar5;
  ConversionModeFlag in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffa8;
  bool local_39;
  QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4> local_28;
  QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4> local_24;
  QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4> local_20;
  QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4> local_1c;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = operator==((QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4>)
                     SUB84((ulong)in_stack_ffffffffffffffa8 >> 0x20,0),in_stack_ffffffffffffffa0);
  if (bVar1) {
    local_39 = false;
  }
  else {
    local_10 = *in_RSI;
    if (local_10 == 0) {
      uVar2 = qFromBigEndian<unsigned_int>
                        ((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c & 0xffffff;
      if (uVar2 == 0xffff) {
        local_1c.super_QFlagsStorage<QHostAddress::ConversionModeFlag>.i =
             (QFlagsStorage<QHostAddress::ConversionModeFlag>)
             QFlags<QHostAddress::ConversionModeFlag>::operator&
                       ((QFlags<QHostAddress::ConversionModeFlag> *)
                        CONCAT44(0xffff,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c);
        IVar3 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
        in_stack_ffffffffffffff9c = CONCAT13(IVar3 != 0,(int3)in_stack_ffffffffffffff9c);
      }
      if ((char)(in_stack_ffffffffffffff9c >> 0x18) == '\0') {
        if (uVar2 == 0) {
          uVar4 = qFromBigEndian<unsigned_int>((void *)(ulong)in_stack_ffffffffffffffa0);
          CVar5 = CONCAT13((char)(in_stack_ffffffffffffff9c >> 0x18),
                           (uint3)(ushort)in_stack_ffffffffffffff9c);
          if (uVar4 == 0) {
            local_20.super_QFlagsStorage<QHostAddress::ConversionModeFlag>.i =
                 (QFlagsStorage<QHostAddress::ConversionModeFlag>)
                 QFlags<QHostAddress::ConversionModeFlag>::operator&
                           ((QFlags<QHostAddress::ConversionModeFlag> *)((ulong)uVar2 << 0x20),CVar5
                           );
            IVar3 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_20);
            CVar5 = CONCAT13((char)(CVar5 >> 0x18),CONCAT12(IVar3 != 0,(short)CVar5));
          }
          if ((char)(CVar5 >> 0x10) == '\0') {
            CVar5 = CONCAT22((short)(CVar5 >> 0x10),(ushort)(byte)CVar5);
            if (uVar4 == 1) {
              local_24.super_QFlagsStorage<QHostAddress::ConversionModeFlag>.i =
                   (QFlagsStorage<QHostAddress::ConversionModeFlag>)
                   QFlags<QHostAddress::ConversionModeFlag>::operator&
                             ((QFlags<QHostAddress::ConversionModeFlag> *)CONCAT44(uVar2,1),CVar5);
              uVar6 = (undefined2)(CVar5 >> 0x10);
              IVar3 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_24);
              CVar5 = (uint)CONCAT21(uVar6,IVar3 != 0) << 8;
            }
            if ((char)(CVar5 >> 8) == '\0') {
              CVar5 = CVar5 & ~TolerantConversion;
              if (uVar4 != 1) {
                local_28.super_QFlagsStorage<QHostAddress::ConversionModeFlag>.i =
                     (QFlagsStorage<QHostAddress::ConversionModeFlag>)
                     QFlags<QHostAddress::ConversionModeFlag>::operator&
                               ((QFlags<QHostAddress::ConversionModeFlag> *)CONCAT44(uVar2,uVar4),
                                CVar5);
                IVar3 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_28);
                CVar5 = (ConversionModeFlag)(IVar3 != 0);
              }
              if ((char)CVar5 == '\0') {
                local_39 = false;
              }
              else {
                *in_RDI = uVar4;
                local_39 = true;
              }
            }
            else {
              *in_RDI = 0x7f000001;
              local_39 = true;
            }
          }
          else {
            *in_RDI = 0;
            local_39 = true;
          }
        }
        else {
          local_39 = false;
        }
      }
      else {
        uVar2 = qFromBigEndian<unsigned_int>((void *)CONCAT44(uVar2,in_stack_ffffffffffffffa0));
        *in_RDI = uVar2;
        local_39 = true;
      }
    }
    else {
      local_39 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

static bool convertToIpv4(quint32& a, const Q_IPV6ADDR &a6, const QHostAddress::ConversionMode mode)
{
    if (mode == QHostAddress::StrictConversion)
        return false;

    const uchar *ptr = a6.c;
    if (qFromUnaligned<quint64>(ptr) != 0)
        return false;

    const quint32 mid = qFromBigEndian<quint32>(ptr + 8);
    if ((mid == 0xffff) && (mode & QHostAddress::ConvertV4MappedToIPv4)) {
        a = qFromBigEndian<quint32>(ptr + 12);
        return true;
    }
    if (mid != 0)
        return false;

    const quint32 low = qFromBigEndian<quint32>(ptr + 12);
    if ((low == 0) && (mode & QHostAddress::ConvertUnspecifiedAddress)) {
        a = 0;
        return true;
    }
    if ((low == 1) && (mode & QHostAddress::ConvertLocalHost)) {
        a = INADDR_LOOPBACK;
        return true;
    }
    if ((low != 1) && (mode & QHostAddress::ConvertV4CompatToIPv4)) {
        a = low;
        return true;
    }
    return false;
}